

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

long __thiscall chaiscript::Boxed_Number::get_as<long>(Boxed_Number *this)

{
  Common_Types CVar1;
  bad_any_cast *this_00;
  Boxed_Number *this_local;
  
  CVar1 = get_common_type(&this->bv);
  switch(CVar1) {
  case t_int32:
    this_local = (Boxed_Number *)get_as_aux<long,int>(&this->bv);
    break;
  case t_double:
    this_local = (Boxed_Number *)get_as_aux<long,double>(&this->bv);
    break;
  case t_uint8:
    this_local = (Boxed_Number *)get_as_aux<long,unsigned_char>(&this->bv);
    break;
  case t_int8:
    this_local = (Boxed_Number *)get_as_aux<long,signed_char>(&this->bv);
    break;
  case t_uint16:
    this_local = (Boxed_Number *)get_as_aux<long,unsigned_short>(&this->bv);
    break;
  case t_int16:
    this_local = (Boxed_Number *)get_as_aux<long,short>(&this->bv);
    break;
  case t_uint32:
    this_local = (Boxed_Number *)get_as_aux<long,unsigned_int>(&this->bv);
    break;
  case t_uint64:
    this_local = (Boxed_Number *)get_as_aux<long,unsigned_long>(&this->bv);
    break;
  case t_int64:
    this_local = (Boxed_Number *)get_as_aux<long,long>(&this->bv);
    break;
  case t_float:
    this_local = (Boxed_Number *)get_as_aux<long,float>(&this->bv);
    break;
  case t_long_double:
    this_local = (Boxed_Number *)get_as_aux<long,long_double>(&this->bv);
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  return (long)this_local;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }